

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O3

QPDFObjectHandle __thiscall
QPDFParser::parse(QPDFParser *this,InputSource *input,string *object_description,QPDF *context)

{
  int iVar1;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  QPDFObjectHandle QVar3;
  Tokenizer tokenizer;
  undefined1 local_179;
  undefined1 local_178 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108 [3];
  InputSource *local_d0;
  string *local_c8;
  Tokenizer *local_c0;
  undefined8 local_b8;
  QPDF *local_b0;
  InputSource *local_a8;
  string *psStack_a0;
  undefined1 local_98;
  undefined8 local_94;
  undefined1 local_8c;
  vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_> local_88;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined8 local_64;
  undefined8 local_58;
  undefined4 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  ::qpdf::Tokenizer::Tokenizer((Tokenizer *)(local_178 + 0x10));
  iVar1 = (*input->_vptr_InputSource[3])(input);
  make_description((QPDFParser *)local_178,(string *)CONCAT44(extraout_var,iVar1),object_description
                  );
  local_b8 = 0;
  local_a8 = (InputSource *)local_178._0_8_;
  psStack_a0 = (string *)local_178._8_8_;
  local_178._0_8_ = (InputSource *)0x0;
  local_178._8_8_ = (string *)0x0;
  local_98 = 0;
  local_88.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_70 = 0;
  local_68 = 0;
  local_94 = 0;
  local_8c = 0;
  local_64 = 0xf;
  local_58 = 0;
  local_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_d0 = input;
  local_c8 = object_description;
  local_c0 = (Tokenizer *)(local_178 + 0x10);
  local_b0 = context;
  parse(this,(bool *)&local_d0,SUB81(&local_179,0));
  std::vector<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>::~vector(&local_88);
  _Var2._M_pi = extraout_RDX;
  if (psStack_a0 != (string *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psStack_a0);
    _Var2._M_pi = extraout_RDX_00;
  }
  if ((string *)local_178._8_8_ != (string *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
    _Var2._M_pi = extraout_RDX_01;
  }
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0]._M_allocated_capacity + 1);
    _Var2._M_pi = extraout_RDX_02;
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,(ulong)(local_128._M_allocated_capacity + 1));
    _Var2._M_pi = extraout_RDX_03;
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,(ulong)(local_148._M_allocated_capacity + 1));
    _Var2._M_pi = extraout_RDX_04;
  }
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFParser::parse(InputSource& input, std::string const& object_description, QPDF* context)
{
    qpdf::Tokenizer tokenizer;
    bool empty = false;
    return QPDFParser(
               input,
               make_description(input.getName(), object_description),
               object_description,
               tokenizer,
               nullptr,
               context,
               false)
        .parse(empty, false);
}